

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

shared_ptr<mocker::nasm::MemoryAddr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::buildMemAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Reg> *addr)

{
  __shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::nasm::MemoryAddr> sVar1;
  undefined1 auStack_38 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<mocker::ir::Reg,void>
            ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x10),in_RDX
            );
  getIrAddr((FuncSelectionContext *)auStack_38,(shared_ptr<mocker::ir::Addr> *)addr);
  std::make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>>
            ((shared_ptr<mocker::nasm::Addr> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  sVar1.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::MemoryAddr>)
         sVar1.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::MemoryAddr>
  buildMemAddr(const std::shared_ptr<ir::Reg> &addr) const {
    // TODO
    return std::make_shared<nasm::MemoryAddr>(getIrAddr(addr));
  }